

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half4 *value)

{
  bool bVar1;
  half hVar2;
  float4 v;
  array<float,_4UL> local_20;
  
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,&local_20);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[0]);
    value->_M_elems[0].value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[1]);
    value->_M_elems[1].value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[2]);
    value->_M_elems[2].value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[3]);
    value->_M_elems[3].value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half4 *value) {
  // Parse as float
  value::float4 v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value)[0] = value::float_to_half_full(v[0]);
  (*value)[1] = value::float_to_half_full(v[1]);
  (*value)[2] = value::float_to_half_full(v[2]);
  (*value)[3] = value::float_to_half_full(v[3]);
  return true;
}